

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBucket.cpp
# Opt level: O1

void __thiscall
Memory::LargeHeapBucket::ScanNewImplicitRoots(LargeHeapBucket *this,Recycler *recycler)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  LargeHeapBlock *heapBlock;
  LargeHeapBlock *pLVar4;
  
  for (pLVar4 = this->largeBlockList; pLVar4 != (LargeHeapBlock *)0x0; pLVar4 = pLVar4->next) {
    LargeHeapBlock::ScanNewImplicitRoots(pLVar4,recycler);
  }
  for (pLVar4 = this->largePageHeapBlockList; pLVar4 != (LargeHeapBlock *)0x0; pLVar4 = pLVar4->next
      ) {
    LargeHeapBlock::ScanNewImplicitRoots(pLVar4,recycler);
  }
  for (pLVar4 = this->fullLargeBlockList; pLVar4 != (LargeHeapBlock *)0x0; pLVar4 = pLVar4->next) {
    LargeHeapBlock::ScanNewImplicitRoots(pLVar4,recycler);
  }
  for (pLVar4 = this->pendingDisposeLargeBlockList; pLVar4 != (LargeHeapBlock *)0x0;
      pLVar4 = pLVar4->next) {
    LargeHeapBlock::ScanNewImplicitRoots(pLVar4,recycler);
  }
  if (this->pendingSweepLargeBlockList != (LargeHeapBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBucket.cpp"
                       ,0x240,"(pendingSweepLargeBlockList == nullptr)",
                       "pendingSweepLargeBlockList == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return;
}

Assistant:

void
LargeHeapBucket::ScanNewImplicitRoots(Recycler * recycler)
{
    HeapBlockList::ForEach(largeBlockList, [recycler](LargeHeapBlock * heapBlock)
    {
        heapBlock->ScanNewImplicitRoots(recycler);
    });
#ifdef RECYCLER_PAGE_HEAP
    HeapBlockList::ForEach(largePageHeapBlockList, [recycler](LargeHeapBlock * heapBlock)
    {
        heapBlock->ScanNewImplicitRoots(recycler);
    });
#endif
    HeapBlockList::ForEach(fullLargeBlockList, [recycler](LargeHeapBlock * heapBlock)
    {
        heapBlock->ScanNewImplicitRoots(recycler);
    });
    HeapBlockList::ForEach(pendingDisposeLargeBlockList, [recycler](LargeHeapBlock * heapBlock)
    {
        heapBlock->ScanNewImplicitRoots(recycler);
    });
#if ENABLE_CONCURRENT_GC
    Assert(pendingSweepLargeBlockList == nullptr);
#endif
}